

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_nullmutex>::set_color
          (ansicolor_sink<spdlog::details::console_nullmutex> *this,level_enum color_level,
          string_view_t color)

{
  reference this_00;
  string local_40;
  string_view_t *local_20;
  size_t local_18;
  
  local_18 = color.size_;
  local_20 = (string_view_t *)color.data_;
  to_string__abi_cxx11_
            (&local_40,
             (ansicolor_sink<spdlog::details::console_nullmutex> *)&stack0xffffffffffffffe0,local_20
            );
  this_00 = std::
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
            ::at(&this->colors_,(long)(int)color_level);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level,
                                                           string_view_t color) {
    std::lock_guard<mutex_t> lock(mutex_);
    colors_.at(static_cast<size_t>(color_level)) = to_string_(color);
}